

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathIsNodeType(xmlChar *name)

{
  int iVar1;
  uint uVar2;
  
  if (name == (xmlChar *)0x0) {
    uVar2 = 0;
  }
  else {
    iVar1 = xmlStrEqual(name,"node");
    uVar2 = 1;
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(name,"text");
      if (iVar1 == 0) {
        iVar1 = xmlStrEqual(name,"comment");
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(name,(xmlChar *)"processing-instruction");
          uVar2 = (uint)(iVar1 != 0);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int
xmlXPathIsNodeType(const xmlChar *name) {
    if (name == NULL)
	return(0);

    if (xmlStrEqual(name, BAD_CAST "node"))
	return(1);
    if (xmlStrEqual(name, BAD_CAST "text"))
	return(1);
    if (xmlStrEqual(name, BAD_CAST "comment"))
	return(1);
    if (xmlStrEqual(name, BAD_CAST "processing-instruction"))
	return(1);
    return(0);
}